

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

Simd128ConstOpnd * __thiscall
IR::Simd128ConstOpnd::New(Simd128ConstOpnd *this,AsmJsSIMDValue value,IRType type,Func *func)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  JitArenaAllocator *alloc;
  Simd128ConstOpnd *this_01;
  undefined7 in_register_00000009;
  TrackAllocData local_58;
  Simd128ConstOpnd *simd128ConstOpnd;
  Func *func_local;
  Simd128ConstOpnd *pSStack_18;
  IRType type_local;
  AsmJsSIMDValue value_local;
  
  simd128ConstOpnd = (Simd128ConstOpnd *)CONCAT71(in_register_00000009,type);
  value_local.field_0.i64[0] = value.field_0._0_8_;
  func_local._7_1_ = value.field_0._8_1_;
  this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
            (simd128ConstOpnd->super_Opnd)._vptr_Opnd;
  pSStack_18 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
             ,0x769);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (this_00,&local_58);
  this_01 = (Simd128ConstOpnd *)new<Memory::JitArenaAllocator>(0x20,alloc,0x4e98c0);
  memset(this_01,0,0x20);
  Simd128ConstOpnd(this_01);
  (this_01->m_value).field_0.f64[0] = (Type)pSStack_18;
  (this_01->m_value).field_0.f64[1] = value_local.field_0.f64[0];
  (this_01->super_Opnd).m_type = func_local._7_1_;
  (this_01->super_Opnd).m_kind = OpndKindSimd128Const;
  return this_01;
}

Assistant:

Simd128ConstOpnd *
Simd128ConstOpnd::New(AsmJsSIMDValue value, IRType type, Func *func)
{
    Simd128ConstOpnd * simd128ConstOpnd;

    simd128ConstOpnd = JitAnew(func->m_alloc, IR::Simd128ConstOpnd);

    simd128ConstOpnd->m_value = value;
    simd128ConstOpnd->m_type = type;

    simd128ConstOpnd->m_kind = OpndKindSimd128Const;


    return simd128ConstOpnd;
}